

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,string *command,string *output,int *retVal,char *dir,cmDuration timeout,
          ostream *ofs,Encoding encoding)

{
  pointer ppcVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  cmsysProcess *pcVar6;
  ostream *poVar7;
  char *pcVar8;
  long *plVar9;
  size_type sVar10;
  ulong uVar11;
  pointer ppcVar12;
  ulong uVar13;
  long lVar14;
  string *a;
  pointer pbVar15;
  cmProcessOutput processOutput;
  string strdata;
  int length;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  ostringstream cmCTestLog_msg;
  char *data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 auStack_288 [7];
  cmProcessOutput local_281;
  long *local_280;
  long local_270 [2];
  cmCTest *local_260;
  string local_258;
  string *local_238;
  cmsysProcess *local_230;
  ostream *local_228;
  int local_21c;
  vector<const_char_*,_std::allocator<const_char_*>_> local_218;
  undefined1 local_1f8 [376];
  int *local_80;
  rep_conflict local_78;
  char *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_260 = this;
  local_238 = output;
  local_230 = (cmsysProcess *)dir;
  local_228 = ofs;
  local_78 = timeout.__r;
  cmSystemTools::ParseArguments(&local_68,command);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 0;
    goto LAB_0014e7de;
  }
  local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = retVal;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_218,
             ((long)local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar15 = local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_1f8._0_8_ = (pbVar15->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_218,(char **)local_1f8);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 !=
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_1f8._0_8_ = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_218,(char **)local_1f8);
  local_238->_M_string_length = 0;
  *(local_238->_M_dataplus)._M_p = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Run command:",0xc);
  std::__cxx11::stringbuf::str();
  Log(local_260,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x407,local_258._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
  ppcVar1 = local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar12 = local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pcVar8 = *ppcVar12;
      if (pcVar8 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8," \"",2);
      sVar5 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,pcVar8,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"\"",1);
      std::__cxx11::stringbuf::str();
      Log(local_260,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0x40c,local_258._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
      std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
      ppcVar12 = ppcVar12 + 1;
    } while (ppcVar12 != ppcVar1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ios::widen((char)(ostringstream *)local_1f8 + (char)*(_func_int **)(local_1f8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1f8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_260,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x40e,local_258._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
  pcVar6 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (pcVar6,local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(pcVar6,(char *)local_230);
  cmsysProcess_SetOption(pcVar6,0,1);
  cmsysProcess_SetTimeout(pcVar6,local_78);
  cmsysProcess_Execute(pcVar6);
  cmProcessOutput::cmProcessOutput(&local_281,encoding,0x400);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1f8,"   Each . represents ",0x15);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," bytes of output",0x10);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    ",4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_260,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x424,(char *)local_280,false);
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
  uVar11 = 0;
  local_230 = pcVar6;
  while (iVar3 = cmsysProcess_WaitForData(pcVar6,&local_70,&local_21c,(double *)0x0), iVar3 != 0) {
    cmProcessOutput::DecodeText(&local_281,local_70,(long)local_21c,&local_258,0);
    if (local_258._M_string_length != 0) {
      sVar10 = 0;
      do {
        if (local_258._M_dataplus._M_p[sVar10] == '\0') {
          local_258._M_dataplus._M_p[sVar10] = '\n';
        }
        sVar10 = sVar10 + 1;
      } while (local_258._M_string_length != sVar10);
    }
    std::__cxx11::string::_M_append((char *)local_238,(ulong)local_258._M_dataplus._M_p);
    uVar13 = uVar11 << 10;
    if (uVar13 < local_238->_M_string_length) {
      lVar14 = -uVar11;
      do {
        uVar11 = uVar11 + 1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,".",1);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_260,3,
            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
            ,0x42f,(char *)local_280,false);
        if (local_280 != local_270) {
          operator_delete(local_280,local_270[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
        std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
        if ((lVar14 != 1) && ((uVar11 / 0x32) * -0x32 + 1 == lVar14)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"  Size: ",8);
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             ((ostringstream *)local_1f8,
                              (int)((((double)CONCAT44(0x45300000,
                                                       (int)(local_238->_M_string_length >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)local_238->_M_string_length) -
                                    4503599627370496.0)) * 0.0009765625 + 1.0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"K",1);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    ",4);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(local_260,3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
              ,0x434,(char *)local_280,false);
          if (local_280 != local_270) {
            operator_delete(local_280,local_270[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
          std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
        }
        lVar14 = lVar14 + -1;
        uVar13 = uVar13 + 0x400;
      } while (uVar13 < local_238->_M_string_length);
      uVar11 = -lVar14;
      pcVar6 = local_230;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    if (local_258._M_string_length != 0) {
      std::ostream::write((char *)local_1f8,(long)local_258._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_260,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x438,(char *)local_280,false);
    if (local_280 != local_270) {
      operator_delete(local_280,local_270[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
    if ((((&local_228->field_0x20)[(long)local_228->_vptr_basic_ostream[-3]] & 5) == 0) &&
       (local_258._M_string_length != 0)) {
      std::ostream::write((char *)local_228,(long)local_258._M_dataplus._M_p);
      std::ostream::flush();
    }
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  cmProcessOutput::DecodeText(&local_281,&local_50,&local_258,0);
  piVar2 = local_80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  pcVar6 = local_230;
  if (local_258._M_string_length != 0) {
    std::__cxx11::string::_M_append((char *)local_238,(ulong)local_258._M_dataplus._M_p);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    if (local_258._M_string_length != 0) {
      std::ostream::write(local_1f8,(long)local_258._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_260,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x441,(char *)local_280,false);
    if (local_280 != local_270) {
      operator_delete(local_280,local_270[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
    if ((((&local_228->field_0x20)[(long)local_228->_vptr_basic_ostream[-3]] & 5) == 0) &&
       (local_258._M_string_length != 0)) {
      std::ostream::write((char *)local_228,(long)local_258._M_dataplus._M_p);
      std::ostream::flush();
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8," Size of output: ",0x11);
  poVar7 = (ostream *)
           std::ostream::operator<<
                     (local_1f8,
                      (int)((((double)CONCAT44(0x45300000,(int)(local_238->_M_string_length >> 0x20)
                                              ) - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_238->_M_string_length) -
                            4503599627370496.0)) * 0.0009765625));
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"K",1);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_260,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x448,(char *)local_280,false);
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
  cmsysProcess_WaitForExit(pcVar6,(double *)0x0);
  iVar3 = cmsysProcess_GetState(pcVar6);
  switch(iVar3) {
  case 1:
    std::__cxx11::string::append((char *)local_238);
    cmsysProcess_GetErrorString(pcVar6);
    std::__cxx11::string::append((char *)local_238);
    std::__cxx11::string::append((char *)local_238);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,"There was an error: ",0x14);
    pcVar8 = cmsysProcess_GetErrorString(local_230);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)(auStack_288 + (long)*(_func_int **)(local_1f8._0_8_ + -0x18)) + 0x90);
    }
    else {
      sVar5 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,pcVar8,sVar5);
    }
    std::ios::widen((char)(ostream *)local_1f8 + (char)*(_func_int **)(local_1f8._0_8_ + -0x18));
    std::ostream::put((char)local_1f8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_260,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x45e,(char *)local_280,false);
    pcVar6 = local_230;
    break;
  case 2:
    iVar4 = cmsysProcess_GetExitException(pcVar6);
    *piVar2 = iVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,"There was an exception: ",0x18);
    plVar9 = (long *)std::ostream::operator<<(local_1f8,*piVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_260,6,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x455,(char *)local_280,false);
    break;
  default:
    goto switchD_0014e44e_caseD_3;
  case 4:
    iVar4 = cmsysProcess_GetExitValue(pcVar6);
    *piVar2 = iVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,"Command exited with the value: ",0x1f);
    plVar9 = (long *)std::ostream::operator<<(local_1f8,*piVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_260,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x451,(char *)local_280,false);
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,"There was a timeout",0x13);
    std::ios::widen((char)(ostream *)local_1f8 + (char)*(_func_int **)(local_1f8._0_8_ + -0x18));
    std::ostream::put((char)local_1f8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_260,6,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x457,(char *)local_280,false);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base((ios_base *)(local_1f8 + 0x70));
switchD_0014e44e_caseD_3:
  cmsysProcess_Delete(pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_281);
  if (local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0014e7de:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return iVar3;
}

Assistant:

int cmCTest::RunMakeCommand(const std::string& command, std::string& output,
                            int* retVal, const char* dir, cmDuration timeout,
                            std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  output.clear();
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << arg << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             "   Each . represents " << tick_len << " bytes of output"
                                     << std::endl
                                     << "    " << std::flush);
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    for (char& cc : strdata) {
      if (cc == 0) {
        cc = '\n';
      }
    }
    output.append(strdata);
    while (output.size() > (tick * tick_len)) {
      tick++;
      cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
      if (tick % tick_line_len == 0 && tick > 0) {
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                   "  Size: " << int((double(output.size()) / 1024.0) + 1)
                              << "K" << std::endl
                              << "    " << std::flush);
      }
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    output.append(strdata);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             " Size of output: " << int(double(output.size()) / 1024.0) << "K"
                                 << std::endl);

  cmsysProcess_WaitForExit(cp, nullptr);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               "Command exited with the value: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Exception) {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING,
               "There was an exception: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  } else if (result == cmsysProcess_State_Error) {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);

  return result;
}